

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void deqp::gls::LifetimeTests::details::readRectangle
               (RenderContext *renderCtx,Rectangle *rect,Surface *dst)

{
  int x;
  int y;
  PixelBufferAccess local_50;
  
  tcu::Surface::setSize(dst,rect->width,rect->height);
  x = rect->x;
  y = rect->y;
  tcu::Surface::getAccess(&local_50,dst);
  glu::readPixels(renderCtx,x,y,&local_50);
  return;
}

Assistant:

void readRectangle (const RenderContext& renderCtx, const Rectangle& rect, Surface& dst)
{
	dst.setSize(rect.width, rect.height);
	glu::readPixels(renderCtx, rect.x, rect.y, dst.getAccess());
}